

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jit_compiler_x86.cpp
# Opt level: O0

void __thiscall randomx::JitCompilerX86::h_ISWAP_R(JitCompilerX86 *this,Instruction *instr,int i)

{
  int in_EDX;
  long in_RSI;
  JitCompilerX86 *in_RDI;
  uint8_t (*in_stack_ffffffffffffffd8) [2];
  
  if (*(char *)(in_RSI + 2) != *(char *)(in_RSI + 1)) {
    in_RDI->registerUsage[*(byte *)(in_RSI + 1)] = in_EDX;
    in_RDI->registerUsage[*(byte *)(in_RSI + 2)] = in_EDX;
    emit<2ul>(in_RDI,in_stack_ffffffffffffffd8);
    emitByte(in_RDI,*(char *)(in_RSI + 2) + -0x40 + *(char *)(in_RSI + 1) * '\b');
  }
  return;
}

Assistant:

void JitCompilerX86::h_ISWAP_R(Instruction& instr, int i) {
		if (instr.src != instr.dst) {
			registerUsage[instr.dst] = i;
			registerUsage[instr.src] = i;
			emit(REX_XCHG);
			emitByte(0xc0 + instr.src + 8 * instr.dst);
		}
	}